

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::TransferSlotAfterSoo
          (HashSetResizeHelper *this,CommonFields *c,size_t slot_size)

{
  if (this[0x19] == (HashSetResizeHelper)0x0) {
    __assert_fail("was_soo_",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x1fe,
                  "void absl::container_internal::HashSetResizeHelper::TransferSlotAfterSoo(CommonFields &, size_t)"
                 );
  }
  if (this[0x1a] != (HashSetResizeHelper)0x0) {
    if (c->capacity_ < 0x11) {
      memcpy((void *)((long)(c->heap_or_soo_).heap.slot_array.p + slot_size),this,slot_size);
      return;
    }
    __assert_fail("is_single_group(c.capacity())",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x200,
                  "void absl::container_internal::HashSetResizeHelper::TransferSlotAfterSoo(CommonFields &, size_t)"
                 );
  }
  __assert_fail("had_soo_slot_",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x1ff,
                "void absl::container_internal::HashSetResizeHelper::TransferSlotAfterSoo(CommonFields &, size_t)"
               );
}

Assistant:

void HashSetResizeHelper::TransferSlotAfterSoo(CommonFields& c,
                                               size_t slot_size) {
  assert(was_soo_);
  assert(had_soo_slot_);
  assert(is_single_group(c.capacity()));
  std::memcpy(SlotAddress(c.slot_array(), SooSlotIndex(), slot_size),
              old_soo_data(), slot_size);
  PoisonSingleGroupEmptySlots(c, slot_size);
}